

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmValue * CompileVmYield(ExpressionContext *ctx,VmModule *module,ExprYield *node)

{
  uint uVar1;
  VmFunction *pVVar2;
  VmBlock *block;
  VmValue *pVVar3;
  VmInstruction *value;
  uint uVar4;
  VmValue *unaff_RBX;
  VmInstructionType cmd;
  
  pVVar3 = CompileVm(ctx,module,node->value);
  if (node->coroutineStateUpdate != (ExprBase *)0x0) {
    CompileVm(ctx,module,node->coroutineStateUpdate);
  }
  if (node->closures != (ExprBase *)0x0) {
    CompileVm(ctx,module,node->closures);
  }
  pVVar2 = module->currentFunction;
  uVar1 = (pVVar2->restoreBlocks).count;
  uVar4 = pVVar2->nextRestoreBlock + 1;
  pVVar2->nextRestoreBlock = uVar4;
  if (uVar4 < uVar1) {
    block = (pVVar2->restoreBlocks).data[uVar4];
    cmd = (VmInstructionType)pVVar3;
    if (node->value->type == ctx->typeVoid) {
      cmd = VM_INST_LOAD_BYTE;
    }
    value = anon_unknown.dwarf_10d873::CreateInstruction
                      ((anon_unknown_dwarf_10d873 *)module,(VmModule *)(node->super_ExprBase).source
                       ,(SynBase *)0x0,(VmType)(ZEXT816(0x21) << 0x40),cmd,(VmValue *)0x0,
                       (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,unaff_RBX);
    VmFunction::AddBlock(module->currentFunction,block);
    module->currentBlock = block;
    pVVar3 = anon_unknown.dwarf_10d873::CheckType(ctx,&node->super_ExprBase,&value->super_VmValue);
    return pVVar3;
  }
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x199,"T &SmallArray<VmBlock *, 4>::operator[](unsigned int) [T = VmBlock *, N = 4]"
               );
}

Assistant:

VmValue* CompileVmYield(ExpressionContext &ctx, VmModule *module, ExprYield *node)
{
	VmValue *value = CompileVm(ctx, module, node->value);

	if(node->coroutineStateUpdate)
		CompileVm(ctx, module, node->coroutineStateUpdate);

	if(node->closures)
		CompileVm(ctx, module, node->closures);

	VmBlock *block = module->currentFunction->restoreBlocks[++module->currentFunction->nextRestoreBlock];

	VmValue *result = node->value->type == ctx.typeVoid ? CreateYield(module, node->source) : CreateYield(module, node->source, value);

	module->currentFunction->AddBlock(block);
	module->currentBlock = block;

	return CheckType(ctx, node, result);
}